

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O2

void cmExtraEclipseCDT4Generator::AppendIncludeDirectories
               (cmXMLWriter *xml,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *includeDirs,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *emittedDirs)

{
  pointer pbVar1;
  bool bVar2;
  iterator iVar3;
  pointer in_relative;
  allocator<char> local_151;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_150;
  _Base_ptr local_148;
  string local_140;
  string dir;
  RegularExpression frameworkRx;
  
  pbVar1 = (includeDirs->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_148 = &(emittedDirs->_M_t)._M_impl.super__Rb_tree_header._M_header;
  local_150 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
               *)emittedDirs;
  for (in_relative = (includeDirs->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start; in_relative != pbVar1;
      in_relative = in_relative + 1) {
    if (in_relative->_M_string_length != 0) {
      cmsys::SystemTools::CollapseFullPath(&dir,in_relative);
      cmsys::RegularExpression::RegularExpression(&frameworkRx,"(.+/Frameworks)/.+\\.framework/");
      bVar2 = cmsys::RegularExpression::find(&frameworkRx,dir._M_dataplus._M_p);
      if (bVar2) {
        cmsys::RegularExpressionMatch::match_abi_cxx11_(&local_140,&frameworkRx.regmatch,1);
        std::__cxx11::string::operator=((string *)&dir,(string *)&local_140);
        std::__cxx11::string::~string((string *)&local_140);
      }
      iVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_150,&dir);
      if (iVar3._M_node == local_148) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>(local_150,&dir);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_140,"pathentry",&local_151);
        cmXMLWriter::StartElement(xml,&local_140);
        std::__cxx11::string::~string((string *)&local_140);
        std::__cxx11::string::string((string *)&local_140,(string *)&dir);
        cmXMLWriter::Attribute<std::__cxx11::string>(xml,"include",&local_140);
        std::__cxx11::string::~string((string *)&local_140);
        cmXMLWriter::Attribute<char[4]>(xml,"kind",(char (*) [4])0x42d3df);
        cmXMLWriter::Attribute<char[1]>(xml,"path",(char (*) [1])0x44814e);
        cmXMLWriter::Attribute<char[5]>(xml,"system",(char (*) [5])0x461e49);
        cmXMLWriter::EndElement(xml);
      }
      cmsys::RegularExpression::~RegularExpression(&frameworkRx);
      std::__cxx11::string::~string((string *)&dir);
    }
  }
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::AppendIncludeDirectories(
  cmXMLWriter& xml, const std::vector<std::string>& includeDirs,
  std::set<std::string>& emittedDirs)
{
  for (std::string const& inc : includeDirs) {
    if (!inc.empty()) {
      std::string dir = cmSystemTools::CollapseFullPath(inc);

      // handle framework include dirs on OSX, the remainder after the
      // Frameworks/ part has to be stripped
      //   /System/Library/Frameworks/GLUT.framework/Headers
      cmsys::RegularExpression frameworkRx("(.+/Frameworks)/.+\\.framework/");
      if (frameworkRx.find(dir)) {
        dir = frameworkRx.match(1);
      }

      if (emittedDirs.find(dir) == emittedDirs.end()) {
        emittedDirs.insert(dir);
        xml.StartElement("pathentry");
        xml.Attribute("include",
                      cmExtraEclipseCDT4Generator::GetEclipsePath(dir));
        xml.Attribute("kind", "inc");
        xml.Attribute("path", "");
        xml.Attribute("system", "true");
        xml.EndElement();
      }
    }
  }
}